

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_e7258::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  uint uVar1;
  ulong uVar2;
  PixelType PVar3;
  bool bVar4;
  byte bVar5;
  __type _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  char *pcVar12;
  float *pfVar13;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar14;
  ChannelList *this_00;
  ChannelList *pCVar15;
  TileDescription *this_01;
  TileDescription *other;
  uint *puVar16;
  reference pvVar17;
  Array2D<void_*> *pAVar18;
  void **ppvVar19;
  Array2D<unsigned_int> *pAVar20;
  size_type sVar21;
  void *pvVar22;
  long lVar23;
  void *pvVar24;
  byte in_CL;
  uint uVar25;
  byte in_DL;
  byte in_SIL;
  int in_EDI;
  float fVar26;
  float fVar27;
  int f_4;
  int k_5;
  int j_4;
  int i_7;
  float *value_2;
  half *value_1;
  uint *value;
  uint l;
  int k_4;
  int j_3;
  int i_6;
  int f_3;
  size_t k_3;
  int tx_1;
  int ty_1;
  int dwx_3;
  int dwy_3;
  int x_3;
  int y_3;
  int f_2;
  size_t k_2;
  int tx;
  int ty;
  int dwx_2;
  int dwy_2;
  int x_2;
  int y_2;
  Box2i box_2;
  int j_2;
  int i_5;
  int f_1;
  size_t k_1;
  int dwx_1;
  int dwy_1;
  int x_1;
  int y_1;
  Box2i box_1;
  int j_1;
  int i_4;
  int f;
  size_t k;
  int dwx;
  int dwy;
  int x;
  int y;
  Box2i box;
  int j;
  int i_3;
  Box2i dataWindowL;
  int lx;
  int ly;
  string str_1;
  stringstream ss_1;
  int pointerSize_1;
  int sampleSize_1;
  PixelType type_1;
  int i_2;
  int pointerSize;
  int sampleSize;
  string str;
  stringstream ss;
  PixelType type;
  int i_1;
  int channels_added;
  vector<int,_std::allocator<int>_> read_channel;
  int memOffset;
  DeepFrameBuffer frameBuffer;
  int i;
  Array<Imf_3_4::Array2D<void_*>_> data;
  int fillChannels;
  Array2D<unsigned_int> localSampleCount;
  Header *fileHeader;
  DeepTiledInputFile file;
  int in_stack_fffffffffffff5e4;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  uint in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5f8;
  DeepFrameBuffer *in_stack_fffffffffffff600;
  void *in_stack_fffffffffffff608;
  void *in_stack_fffffffffffff610;
  long in_stack_fffffffffffff638;
  Array<Imf_3_4::Array2D<void_*>_> *in_stack_fffffffffffff640;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  uint local_62c;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  ulong local_618;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  ulong local_5f0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  ulong local_5b0;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  ulong local_578;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_538;
  int local_534;
  DeepSlice local_530 [56];
  DeepSlice local_4f8 [32];
  stringstream local_4d8 [16];
  undefined1 local_4c8 [380];
  int local_34c;
  int local_348;
  PixelType local_344;
  int local_340;
  undefined4 local_33c;
  DeepSlice local_338 [56];
  int local_300;
  int local_2fc;
  DeepSlice local_2f8 [32];
  stringstream local_2d8 [16];
  undefined1 local_2c8 [376];
  PixelType local_150;
  int local_14c;
  int local_148;
  vector<int,_std::allocator<int>_> local_140;
  Slice local_128 [60];
  int local_ec;
  Slice local_e8 [108];
  int local_7c;
  Array local_78 [20];
  int local_64;
  Array2D<unsigned_int> local_60;
  undefined8 local_38;
  byte local_7;
  byte local_6;
  byte local_5;
  int local_4;
  
  local_5 = in_SIL & 1;
  local_6 = in_DL & 1;
  local_7 = in_CL & 1;
  if ((local_6 != 0) && (local_5 != 0)) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1b6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  local_4 = in_EDI;
  poVar11 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
  pcVar12 = (char *)std::__cxx11::string::c_str();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)&stack0xffffffffffffffd0,pcVar12,4);
  local_38 = Imf_3_4::DeepTiledInputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  if (!bVar4) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bd,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  if (!bVar4) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1be,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar26 = *pfVar13;
  pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar26 != *pfVar13) || (NAN(fVar26) || NAN(*pfVar13))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bf,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar4 = Imath_3_2::Vec2<float>::operator==(this,v);
  if (!bVar4) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar26 = *pfVar13;
  pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar26 == *pfVar13) && (!NAN(fVar26) && !NAN(*pfVar13))) {
    piVar14 = (int *)Imf_3_4::Header::lineOrder();
    iVar7 = *piVar14;
    piVar14 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar7 != *piVar14) {
      __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                    ,0x1c2,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    piVar14 = (int *)Imf_3_4::Header::compression();
    iVar7 = *piVar14;
    piVar14 = (int *)Imf_3_4::Header::compression();
    if (iVar7 != *piVar14) {
      __assert_fail("fileHeader.compression () == header.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                    ,0x1c3,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    this_00 = (ChannelList *)Imf_3_4::Header::channels();
    pCVar15 = (ChannelList *)Imf_3_4::Header::channels();
    bVar5 = Imf_3_4::ChannelList::operator==(this_00,pCVar15);
    if ((bVar5 & 1) == 0) {
      __assert_fail("fileHeader.channels () == header.channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                    ,0x1c4,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    Imf_3_4::Header::type_abi_cxx11_();
    Imf_3_4::Header::type_abi_cxx11_();
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    if (_Var6) {
      this_01 = (TileDescription *)Imf_3_4::Header::tileDescription();
      other = (TileDescription *)Imf_3_4::Header::tileDescription();
      bVar4 = Imf_3_4::TileDescription::operator==(this_01,other);
      if (!bVar4) {
        __assert_fail("fileHeader.tileDescription () == header.tileDescription ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                      ,0x1c6,
                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                     );
      }
      Imf_3_4::Array2D<unsigned_int>::Array2D(&local_60);
      Imf_3_4::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)in_stack_fffffffffffff600,(long)in_stack_fffffffffffff5f8,
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      local_64 = random_int(in_stack_fffffffffffff5e4);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array
                (in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      for (local_7c = 0; local_7c < local_4 + local_64; local_7c = local_7c + 1) {
        Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
        Imf_3_4::Array2D<void_*>::resizeErase
                  ((Array2D<void_*> *)in_stack_fffffffffffff600,(long)in_stack_fffffffffffff5f8,
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      }
      Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff600);
      if ((local_6 & 1) == 0) {
        local_ec = (anonymous_namespace)::dataWindow + DAT_00261fbc * 0x111;
      }
      else {
        local_ec = 0;
      }
      puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_60,0);
      uVar25 = local_6 & 1;
      Imf_3_4::Slice::Slice
                (local_128,UINT,(char *)(puVar16 + -(long)local_ec),4,0x444,1,1,0.0,SUB41(uVar25,0),
                 SUB41(uVar25,0));
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_e8);
      std::allocator<int>::allocator((allocator<int> *)0x18c581);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff600,
                 (size_type)in_stack_fffffffffffff5f8,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      std::allocator<int>::~allocator((allocator<int> *)0x18c5ad);
      local_148 = 0;
      for (local_14c = 0; local_14c < local_4; local_14c = local_14c + 1) {
        if ((local_7 & 1) != 0) {
          iVar7 = random_int(in_stack_fffffffffffff5e4);
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,(long)local_14c);
          *pvVar17 = iVar7;
        }
        if (((local_7 & 1) == 0) ||
           (pvVar17 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,(long)local_14c)
           , *pvVar17 == 1)) {
          local_150 = NUM_PIXELTYPES;
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          if (*pvVar17 == 0) {
            local_150 = UINT;
          }
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          if (*pvVar17 == 1) {
            local_150 = HALF;
          }
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          if (*pvVar17 == 2) {
            local_150 = FLOAT;
          }
          std::__cxx11::stringstream::stringstream(local_2d8);
          std::ostream::operator<<(local_2c8,local_14c);
          std::__cxx11::stringstream::str();
          local_2fc = 0;
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          if (*pvVar17 == 0) {
            local_2fc = 4;
          }
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          if (*pvVar17 == 1) {
            local_2fc = 2;
          }
          pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (anonymous_namespace)::channelTypes,(long)local_14c);
          PVar3 = local_150;
          if (*pvVar17 == 2) {
            local_2fc = 4;
          }
          local_300 = 8;
          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[](pAVar18 + local_14c,0);
          in_stack_fffffffffffff5f0 = local_6 & 1;
          uVar25 = 1;
          Imf_3_4::DeepSlice::DeepSlice
                    (local_338,PVar3,(char *)(ppvVar19 + -(long)local_ec),(long)local_300,
                     (long)(local_300 * 0x111),(long)local_2fc,1,1,0.0,
                     SUB41(in_stack_fffffffffffff5f0,0),SUB41(in_stack_fffffffffffff5f0,0));
          Imf_3_4::DeepFrameBuffer::insert((string *)local_e8,local_2f8);
          local_148 = local_148 + 1;
          std::__cxx11::string::~string((string *)local_2f8);
          std::__cxx11::stringstream::~stringstream(local_2d8);
        }
      }
      if (local_148 == 0) {
        poVar11 = std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
        local_33c = 1;
      }
      else {
        for (local_340 = 0; local_340 < local_64; local_340 = local_340 + 1) {
          local_344 = FLOAT;
          local_348 = 4;
          local_34c = 8;
          std::__cxx11::stringstream::stringstream(local_4d8);
          poVar11 = (ostream *)std::ostream::operator<<(local_4c8,local_340);
          std::operator<<(poVar11,"fill");
          std::__cxx11::stringstream::str();
          PVar3 = local_344;
          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[](pAVar18 + (local_340 + local_4),0);
          in_stack_fffffffffffff5f0 = local_6 & 1;
          uVar25 = 1;
          Imf_3_4::DeepSlice::DeepSlice
                    (local_530,PVar3,(char *)(ppvVar19 + -(long)local_ec),(long)local_34c,
                     (long)(local_34c * 0x111),(long)local_348,1,1,0.0,
                     SUB41(in_stack_fffffffffffff5f0,0),SUB41(in_stack_fffffffffffff5f0,0));
          Imf_3_4::DeepFrameBuffer::insert((string *)local_e8,local_4f8);
          std::__cxx11::string::~string((string *)local_4f8);
          std::__cxx11::stringstream::~stringstream(local_4d8);
        }
        Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&stack0xffffffffffffffd0);
        if ((local_5 & 1) == 0) {
          if ((local_6 & 1) == 0) {
            poVar11 = std::operator<<((ostream *)&std::cout,"per-tile ");
            std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cout,"per-tile with relative coordinates ");
            std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
          }
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,"bulk ");
          std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
        }
        for (local_534 = 0; iVar7 = local_534, iVar8 = Imf_3_4::DeepTiledInputFile::numYLevels(),
            iVar7 < iVar8; local_534 = local_534 + 1) {
          for (local_538 = 0; iVar7 = local_538, iVar8 = Imf_3_4::DeepTiledInputFile::numXLevels(),
              iVar7 < iVar8; local_538 = local_538 + 1) {
            Imf_3_4::DeepTiledInputFile::dataWindowForLevel
                      ((int)&local_548,(int)&stack0xffffffffffffffd0);
            if ((local_5 & 1) == 0) {
              if ((local_5 & 1) == 0) {
                if ((local_6 & 1) == 0) {
                  for (local_580 = 0; iVar7 = local_580,
                      iVar8 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&stack0xffffffffffffffd0),
                      iVar7 < iVar8; local_580 = local_580 + 1) {
                    for (local_584 = 0; iVar7 = local_584,
                        iVar8 = Imf_3_4::DeepTiledInputFile::numXTiles
                                          ((int)&stack0xffffffffffffffd0), iVar7 < iVar8;
                        local_584 = local_584 + 1) {
                      Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                                ((int)&stack0xffffffffffffffd0,local_584,local_580,local_538);
                      Imf_3_4::DeepTiledInputFile::dataWindowForTile
                                ((int)&local_594,(int)&stack0xffffffffffffffd0,local_584,local_580);
                      for (local_598 = local_590; local_598 <= local_588; local_598 = local_598 + 1)
                      {
                        for (local_59c = local_594; local_59c <= local_58c;
                            local_59c = local_59c + 1) {
                          local_5a0 = local_598 - local_544;
                          local_5a4 = local_59c - local_548;
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)local_5a0);
                          uVar1 = puVar16[local_5a4];
                          pAVar20 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::operator[]
                                              ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                                               (anonymous_namespace)::sampleCountWhole,
                                               (long)local_534);
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (pAVar20 + local_538,(long)local_5a0);
                          if (uVar1 != puVar16[local_5a4]) {
                            __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x28c,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          for (local_5b0 = 0; uVar2 = local_5b0,
                              sVar21 = std::vector<int,_std::allocator<int>_>::size
                                                 ((vector<int,_std::allocator<int>_> *)
                                                  (anonymous_namespace)::channelTypes),
                              uVar2 < sVar21; local_5b0 = local_5b0 + 1) {
                            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5b0);
                            if (*pvVar17 == 0) {
                              puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                  (&local_60,(long)local_5a0);
                              pvVar22 = operator_new__((ulong)puVar16[local_5a4] << 2);
                              pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                              ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                   (pAVar18 + local_5b0,(long)local_5a0);
                              ppvVar19[local_5a4] = pvVar22;
                            }
                            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5b0);
                            if (*pvVar17 == 1) {
                              puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                  (&local_60,(long)local_5a0);
                              pvVar22 = operator_new__((ulong)puVar16[local_5a4] * 2);
                              pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                              ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                   (pAVar18 + local_5b0,(long)local_5a0);
                              ppvVar19[local_5a4] = pvVar22;
                            }
                            pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5b0);
                            if (*pvVar17 == 2) {
                              puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                  (&local_60,(long)local_5a0);
                              pvVar22 = operator_new__((ulong)puVar16[local_5a4] << 2);
                              pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                              ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                   (pAVar18 + local_5b0,(long)local_5a0);
                              ppvVar19[local_5a4] = pvVar22;
                            }
                          }
                          for (local_5b4 = 0; local_5b4 < local_64; local_5b4 = local_5b4 + 1) {
                            puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                (&local_60,(long)local_5a0);
                            pvVar22 = operator_new__((ulong)puVar16[local_5a4] << 2);
                            pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                            lVar23 = (long)local_5b4;
                            sVar21 = std::vector<int,_std::allocator<int>_>::size
                                               ((vector<int,_std::allocator<int>_> *)
                                                (anonymous_namespace)::channelTypes);
                            ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                 (pAVar18 + lVar23 + sVar21,(long)local_5a0);
                            ppvVar19[local_5a4] = pvVar22;
                          }
                        }
                      }
                      Imf_3_4::DeepTiledInputFile::readTile
                                ((int)&stack0xffffffffffffffd0,local_584,local_580,local_538);
                    }
                  }
                }
                else if ((local_6 & 1) != 0) {
                  for (local_5b8 = 0; iVar7 = local_5b8,
                      iVar8 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&stack0xffffffffffffffd0),
                      iVar7 < iVar8; local_5b8 = local_5b8 + 1) {
                    for (local_5bc = 0; iVar7 = local_5bc,
                        iVar8 = Imf_3_4::DeepTiledInputFile::numXTiles
                                          ((int)&stack0xffffffffffffffd0), iVar7 < iVar8;
                        local_5bc = local_5bc + 1) {
                      Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                                ((int)&stack0xffffffffffffffd0,local_5bc,local_5b8,local_538);
                      Imf_3_4::DeepTiledInputFile::dataWindowForTile
                                ((int)&local_5cc,(int)&stack0xffffffffffffffd0,local_5bc,local_5b8);
                      for (local_5d0 = local_5c8; local_5d0 <= local_5c0; local_5d0 = local_5d0 + 1)
                      {
                        for (local_5d4 = local_5cc; local_5d4 <= local_5c4;
                            local_5d4 = local_5d4 + 1) {
                          iVar7 = local_5d0 - local_544;
                          iVar8 = local_5d4 - local_548;
                          iVar9 = local_5d0 - local_5c8;
                          iVar10 = local_5d4 - local_5cc;
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)iVar9);
                          uVar1 = puVar16[iVar10];
                          pAVar20 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::operator[]
                                              ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                                               (anonymous_namespace)::sampleCountWhole,
                                               (long)local_534);
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (pAVar20 + local_538,(long)iVar7);
                          if (uVar1 != puVar16[iVar8]) {
                            __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x2be,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          for (local_5f0 = 0;
                              sVar21 = std::vector<int,_std::allocator<int>_>::size
                                                 ((vector<int,_std::allocator<int>_> *)
                                                  (anonymous_namespace)::channelTypes),
                              local_5f0 < sVar21; local_5f0 = local_5f0 + 1) {
                            if (((local_7 & 1) == 0) ||
                               (pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                    (&local_140,local_5f0), *pvVar17 == 1)) {
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_5f0);
                              if (*pvVar17 == 0) {
                                puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                    (&local_60,(long)iVar9);
                                pvVar22 = operator_new__((ulong)puVar16[iVar10] << 2);
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_5f0,(long)iVar9);
                                ppvVar19[iVar10] = pvVar22;
                              }
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_5f0);
                              if (*pvVar17 == 1) {
                                puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                    (&local_60,(long)iVar9);
                                pvVar22 = operator_new__((ulong)puVar16[iVar10] * 2);
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_5f0,(long)iVar9);
                                ppvVar19[iVar10] = pvVar22;
                              }
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_5f0);
                              if (*pvVar17 == 2) {
                                puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                    (&local_60,(long)iVar9);
                                pvVar22 = operator_new__((ulong)puVar16[iVar10] << 2);
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_5f0,(long)iVar9);
                                ppvVar19[iVar10] = pvVar22;
                              }
                            }
                          }
                          for (local_5f4 = 0; local_5f4 < local_64; local_5f4 = local_5f4 + 1) {
                            puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                                (&local_60,(long)iVar9);
                            pvVar22 = operator_new__((ulong)puVar16[iVar10] << 2);
                            pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                            sVar21 = std::vector<int,_std::allocator<int>_>::size
                                               ((vector<int,_std::allocator<int>_> *)
                                                (anonymous_namespace)::channelTypes);
                            ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                 (pAVar18 + (long)local_5f4 + sVar21,(long)iVar9);
                            ppvVar19[iVar10] = pvVar22;
                          }
                        }
                      }
                      Imf_3_4::DeepTiledInputFile::readTile
                                ((int)&stack0xffffffffffffffd0,local_5bc,local_5b8,local_538);
                      for (local_5f8 = local_5c8; local_5f8 <= local_5c0; local_5f8 = local_5f8 + 1)
                      {
                        for (local_5fc = local_5cc; local_5fc <= local_5c4;
                            local_5fc = local_5fc + 1) {
                          iVar7 = local_5f8 - local_5c8;
                          iVar8 = local_5fc - local_5cc;
                          for (local_618 = 0;
                              sVar21 = std::vector<int,_std::allocator<int>_>::size
                                                 ((vector<int,_std::allocator<int>_> *)
                                                  (anonymous_namespace)::channelTypes),
                              local_618 < sVar21; local_618 = local_618 + 1) {
                            if (((local_7 & 1) == 0) ||
                               (pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                    (&local_140,local_618), *pvVar17 == 1)) {
                              pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                              Imf_3_4::Array2D<void_*>::operator[](pAVar18 + local_618,(long)iVar7);
                              Imf_3_4::Array2D<unsigned_int>::operator[](&local_60,(long)iVar7);
                              std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,local_618);
                              checkValue(in_stack_fffffffffffff610,
                                         (int)((ulong)in_stack_fffffffffffff608 >> 0x20),
                                         (int)in_stack_fffffffffffff608,
                                         (int)((ulong)in_stack_fffffffffffff600 >> 0x20),
                                         (int)in_stack_fffffffffffff600);
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_618);
                              if (*pvVar17 == 0) {
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_618,(long)iVar7);
                                if (ppvVar19[iVar8] != (void *)0x0) {
                                  operator_delete__(ppvVar19[iVar8]);
                                }
                              }
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_618);
                              if (*pvVar17 == 1) {
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_618,(long)iVar7);
                                if (ppvVar19[iVar8] != (void *)0x0) {
                                  operator_delete__(ppvVar19[iVar8]);
                                }
                              }
                              pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes,local_618);
                              if (*pvVar17 == 2) {
                                pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                                ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                     (pAVar18 + local_618,(long)iVar7);
                                if (ppvVar19[iVar8] != (void *)0x0) {
                                  operator_delete__(ppvVar19[iVar8]);
                                }
                              }
                            }
                          }
                          for (local_61c = 0; local_61c < local_64; local_61c = local_61c + 1) {
                            pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                            sVar21 = std::vector<int,_std::allocator<int>_>::size
                                               ((vector<int,_std::allocator<int>_> *)
                                                (anonymous_namespace)::channelTypes);
                            ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                                 (pAVar18 + (long)local_61c + sVar21,(long)iVar7);
                            if (ppvVar19[iVar8] != (void *)0x0) {
                              operator_delete__(ppvVar19[iVar8]);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar7 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&stack0xffffffffffffffd0);
              iVar8 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&stack0xffffffffffffffd0);
              Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
                        ((int)&stack0xffffffffffffffd0,0,iVar7 + -1,0,iVar8 + -1,local_538);
              for (local_54c = 0; iVar7 = local_54c,
                  iVar8 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&stack0xffffffffffffffd0),
                  iVar7 < iVar8; local_54c = local_54c + 1) {
                for (local_550 = 0; iVar7 = local_550,
                    iVar8 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&stack0xffffffffffffffd0),
                    iVar7 < iVar8; local_550 = local_550 + 1) {
                  Imf_3_4::DeepTiledInputFile::dataWindowForTile
                            ((int)&local_560,(int)&stack0xffffffffffffffd0,local_550,local_54c);
                  for (local_564 = local_55c; local_564 <= local_554; local_564 = local_564 + 1) {
                    for (local_568 = local_560; local_568 <= local_558; local_568 = local_568 + 1) {
                      local_56c = local_564 - local_544;
                      local_570 = local_568 - local_548;
                      puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                          (&local_60,(long)local_56c);
                      uVar1 = puVar16[local_570];
                      pAVar20 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::operator[]
                                          ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                                           (anonymous_namespace)::sampleCountWhole,(long)local_534);
                      puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                          (pAVar20 + local_538,(long)local_56c);
                      if (uVar1 != puVar16[local_570]) {
                        __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                      ,0x253,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      for (local_578 = 0; uVar2 = local_578,
                          sVar21 = std::vector<int,_std::allocator<int>_>::size
                                             ((vector<int,_std::allocator<int>_> *)
                                              (anonymous_namespace)::channelTypes), uVar2 < sVar21;
                          local_578 = local_578 + 1) {
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,local_578);
                        if (*pvVar17 == 0) {
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)local_56c);
                          pvVar22 = operator_new__((ulong)puVar16[local_570] << 2);
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_578,(long)local_56c);
                          ppvVar19[local_570] = pvVar22;
                        }
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,local_578);
                        if (*pvVar17 == 1) {
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)local_56c);
                          pvVar22 = operator_new__((ulong)puVar16[local_570] * 2);
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_578,(long)local_56c);
                          ppvVar19[local_570] = pvVar22;
                        }
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,local_578);
                        if (*pvVar17 == 2) {
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)local_56c);
                          pvVar22 = operator_new__((ulong)puVar16[local_570] << 2);
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_578,(long)local_56c);
                          ppvVar19[local_570] = pvVar22;
                        }
                      }
                      for (local_57c = 0; local_57c < local_64; local_57c = local_57c + 1) {
                        puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                            (&local_60,(long)local_56c);
                        pvVar22 = operator_new__((ulong)puVar16[local_570] << 2);
                        pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                        lVar23 = (long)local_57c;
                        sVar21 = std::vector<int,_std::allocator<int>_>::size
                                           ((vector<int,_std::allocator<int>_> *)
                                            (anonymous_namespace)::channelTypes);
                        ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                             (pAVar18 + lVar23 + sVar21,(long)local_56c);
                        ppvVar19[local_570] = pvVar22;
                      }
                    }
                  }
                }
              }
              iVar7 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&stack0xffffffffffffffd0);
              iVar8 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&stack0xffffffffffffffd0);
              Imf_3_4::DeepTiledInputFile::readTiles
                        ((int)&stack0xffffffffffffffd0,0,iVar7 + -1,0,iVar8 + -1,local_538);
            }
            if ((local_6 & 1) == 0) {
              for (local_620 = 0;
                  iVar7 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&stack0xffffffffffffffd0),
                  local_620 < iVar7; local_620 = local_620 + 1) {
                for (local_624 = 0;
                    iVar7 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&stack0xffffffffffffffd0),
                    local_624 < iVar7; local_624 = local_624 + 1) {
                  for (local_628 = 0; local_628 < local_4; local_628 = local_628 + 1) {
                    if (((local_7 & 1) == 0) ||
                       (pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            (&local_140,(long)local_628), *pvVar17 == 1)) {
                      for (local_62c = 0;
                          puVar16 = Imf_3_4::Array2D<unsigned_int>::operator[]
                                              (&local_60,(long)local_620),
                          local_62c < puVar16[local_624]; local_62c = local_62c + 1) {
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_628);
                        if (*pvVar17 == 0) {
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_628,(long)local_620);
                          pvVar22 = ppvVar19[local_624];
                          if (*(uint *)((long)pvVar22 + (ulong)local_62c * 4) !=
                              (uint)(local_620 * 0x111 + local_624) % 0x801) {
                            poVar11 = (ostream *)std::ostream::operator<<(&std::cout,local_624);
                            poVar11 = std::operator<<(poVar11,", ");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_620);
                            poVar11 = std::operator<<(poVar11," error, should be ");
                            poVar11 = (ostream *)
                                      std::ostream::operator<<
                                                (poVar11,(local_620 * 0x111 + local_624) % 0x801);
                            poVar11 = std::operator<<(poVar11,", is ");
                            pvVar24 = (void *)std::ostream::operator<<
                                                        (poVar11,*(uint *)((long)pvVar22 +
                                                                          (ulong)local_62c * 4));
                            pvVar24 = (void *)std::ostream::operator<<
                                                        (pvVar24,std::
                                                  endl<char,std::char_traits<char>>);
                            std::ostream::operator<<
                                      (pvVar24,std::flush<char,std::char_traits<char>>);
                          }
                          if (*(uint *)((long)pvVar22 + (ulong)local_62c * 4) !=
                              (uint)(local_620 * 0x111 + local_624) % 0x801) {
                            __assert_fail("value[l] == static_cast<unsigned int> ( i * width + j) % 2049"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x324,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_628);
                        if (*pvVar17 == 1) {
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_628,(long)local_620);
                          pvVar22 = ppvVar19[local_624];
                          fVar26 = Imath_3_2::half::operator_cast_to_float
                                             ((half *)CONCAT44(in_stack_fffffffffffff5e4,uVar25));
                          fVar27 = (float)((local_620 * 0x111 + local_624) % 0x801);
                          if ((fVar26 != fVar27) || (NAN(fVar26) || NAN(fVar27))) {
                            poVar11 = (ostream *)std::ostream::operator<<(&std::cout,local_624);
                            poVar11 = std::operator<<(poVar11,", ");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_620);
                            poVar11 = std::operator<<(poVar11," error, should be ");
                            poVar11 = (ostream *)
                                      std::ostream::operator<<
                                                (poVar11,(local_620 * 0x111 + local_624) % 0x801);
                            poVar11 = std::operator<<(poVar11,", is ");
                            pvVar22 = (void *)::operator<<(poVar11,(half)*(uint16_t *)
                                                                          ((long)pvVar22 +
                                                                          (ulong)local_62c * 2));
                            pvVar22 = (void *)std::ostream::operator<<
                                                        (pvVar22,std::
                                                  endl<char,std::char_traits<char>>);
                            std::ostream::operator<<
                                      (pvVar22,std::flush<char,std::char_traits<char>>);
                          }
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          Imf_3_4::Array2D<void_*>::operator[](pAVar18 + local_628,(long)local_620);
                          fVar26 = Imath_3_2::half::operator_cast_to_float
                                             ((half *)CONCAT44(in_stack_fffffffffffff5e4,uVar25));
                          fVar27 = (float)((local_620 * 0x111 + local_624) % 0x801);
                          if ((fVar26 != fVar27) || (NAN(fVar26) || NAN(fVar27))) {
                            __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x331,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_628);
                        if (*pvVar17 == 2) {
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_628,(long)local_620);
                          pvVar22 = ppvVar19[local_624];
                          fVar26 = *(float *)((long)pvVar22 + (ulong)local_62c * 4);
                          fVar27 = (float)((local_620 * 0x111 + local_624) % 0x801);
                          if ((fVar26 != fVar27) || (NAN(fVar26) || NAN(fVar27))) {
                            poVar11 = (ostream *)std::ostream::operator<<(&std::cout,local_624);
                            poVar11 = std::operator<<(poVar11,", ");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_620);
                            poVar11 = std::operator<<(poVar11," error, should be ");
                            poVar11 = (ostream *)
                                      std::ostream::operator<<
                                                (poVar11,(local_620 * 0x111 + local_624) % 0x801);
                            poVar11 = std::operator<<(poVar11,", is ");
                            pvVar22 = (void *)std::ostream::operator<<
                                                        (poVar11,*(float *)((long)pvVar22 +
                                                                           (ulong)local_62c * 4));
                            pvVar22 = (void *)std::ostream::operator<<
                                                        (pvVar22,std::
                                                  endl<char,std::char_traits<char>>);
                            std::ostream::operator<<
                                      (pvVar22,std::flush<char,std::char_traits<char>>);
                          }
                          pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                          ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                               (pAVar18 + local_628,(long)local_620);
                          fVar26 = *(float *)((long)ppvVar19[local_624] + (ulong)local_62c * 4);
                          fVar27 = (float)((local_620 * 0x111 + local_624) % 0x801);
                          if ((fVar26 != fVar27) || (NAN(fVar26) || NAN(fVar27))) {
                            __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                          ,0x33e,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
              }
              for (local_654 = 0;
                  iVar7 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&stack0xffffffffffffffd0),
                  local_654 < iVar7; local_654 = local_654 + 1) {
                for (local_658 = 0;
                    iVar7 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&stack0xffffffffffffffd0),
                    local_658 < iVar7; local_658 = local_658 + 1) {
                  for (local_65c = 0; local_65c < local_4; local_65c = local_65c + 1) {
                    pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_65c);
                    if (*pvVar17 == 0) {
                      pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                      ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                           (pAVar18 + local_65c,(long)local_654);
                      if (ppvVar19[local_658] != (void *)0x0) {
                        operator_delete__(ppvVar19[local_658]);
                      }
                    }
                    pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_65c);
                    if (*pvVar17 == 1) {
                      pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                      ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                           (pAVar18 + local_65c,(long)local_654);
                      if (ppvVar19[local_658] != (void *)0x0) {
                        operator_delete__(ppvVar19[local_658]);
                      }
                    }
                    pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_65c);
                    if (*pvVar17 == 2) {
                      pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                      ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                           (pAVar18 + local_65c,(long)local_654);
                      in_stack_fffffffffffff610 = ppvVar19[local_658];
                      if (in_stack_fffffffffffff610 != (void *)0x0) {
                        operator_delete__(in_stack_fffffffffffff610);
                      }
                    }
                  }
                  for (local_660 = 0; local_660 < local_64; local_660 = local_660 + 1) {
                    pAVar18 = Imf_3_4::Array::operator_cast_to_Array2D_(local_78);
                    in_stack_fffffffffffff600 = (DeepFrameBuffer *)(long)local_660;
                    sVar21 = std::vector<int,_std::allocator<int>_>::size
                                       ((vector<int,_std::allocator<int>_> *)
                                        (anonymous_namespace)::channelTypes);
                    ppvVar19 = Imf_3_4::Array2D<void_*>::operator[]
                                         (pAVar18 + (long)(&(in_stack_fffffffffffff600->_map)._M_t.
                                                            _M_impl.field_0x0 + sVar21),
                                          (long)local_654);
                    in_stack_fffffffffffff608 = ppvVar19[local_658];
                    if (in_stack_fffffffffffff608 != (void *)0x0) {
                      operator_delete__(in_stack_fffffffffffff608);
                    }
                  }
                }
              }
            }
          }
        }
        local_33c = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x18edd3);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array
                ((Array<Imf_3_4::Array2D<void_*>_> *)in_stack_fffffffffffff600);
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5e4,uVar25));
      Imf_3_4::DeepTiledInputFile::~DeepTiledInputFile
                ((DeepTiledInputFile *)CONCAT44(in_stack_fffffffffffff5e4,uVar25));
      return;
    }
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c5,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                ,0x1c1,
                "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)");
}

Assistant:

void
readFile (
    int                channelCount,
    bool               bulkRead,
    bool               relativeCoords,
    bool               randomChannels,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str (), 4);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());
    assert (fileHeader.tileDescription () == header.tileDescription ());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&localSampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    vector<int> read_channel (channelCount);
    int         channels_added = 0;
    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str,
                DeepSlice (
                    type,
                    (char*) (&data[i][0][0] - memOffset),
                    pointerSize * 1,
                    pointerSize * width,
                    sampleSize,
                    1,
                    1,
                    0,
                    relativeCoords,
                    relativeCoords));
            channels_added++;
        }
    }
    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i + channelCount][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);

                for (int i = 0; i < file.numYTiles (ly); i++)
                {
                    for (int j = 0; j < file.numXTiles (lx); j++)
                    {
                        Box2i box = file.dataWindowForTile (j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert (
                                    localSampleCount[dwy][dwx] ==
                                    sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size ();
                                     k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int
                                            [localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[localSampleCount[dwy]
                                                                     [dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[localSampleCount[dwy]
                                                                      [dwx]];
                                }

                                for (int f = 0; f < fillChannels; ++f)
                                {
                                    data[f + channelTypes.size ()][dwy][dwx] =
                                        new float[localSampleCount[dwy][dwx]];
                                }
                            }
                    }
                }

                file.readTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert (
                                        localSampleCount[dwy][dwx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[localSampleCount[dwy]
                                                                         [dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][dwy]
                                            [dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;
                                    assert (
                                        localSampleCount[ty][tx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            if (channelTypes[k] == 0)
                                                data[k][ty][tx] =
                                                    new unsigned int
                                                        [localSampleCount[ty]
                                                                         [tx]];
                                            if (channelTypes[k] == 1)
                                                data[k][ty][tx] = new half
                                                    [localSampleCount[ty][tx]];
                                            if (channelTypes[k] == 2)
                                                data[k][ty][tx] = new float
                                                    [localSampleCount[ty][tx]];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][ty][tx] =
                                            new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            checkValue (
                                                data[k][ty][tx],
                                                localSampleCount[ty][tx],
                                                channelTypes[k],
                                                dwx,
                                                dwy);
                                            if (channelTypes[k] == 0)
                                                delete[] (unsigned int*)
                                                    data[k][ty][tx];
                                            if (channelTypes[k] == 1)
                                                delete[] (
                                                    half*) data[k][ty][tx];
                                            if (channelTypes[k] == 2)
                                                delete[] (
                                                    float*) data[k][ty][tx];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        delete[] (float*)
                                            data[f + channelTypes.size ()][ty]
                                                [tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (!randomChannels || read_channel[k] == 1)
                            {
                                for (unsigned int l = 0;
                                     l < localSampleCount[i][j];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value =
                                            (unsigned int*) (data[k][i][j]);
                                        if (value[l] !=
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            value[l] ==
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((half*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((float*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[] (unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[] (half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[] (float*) data[k][i][j];
                        }
                        for (int f = 0; f < fillChannels; ++f)
                        {
                            delete[] (
                                float*) data[f + channelTypes.size ()][i][j];
                        }
                    }
            }
        }
}